

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
::operator()(optimize_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,quadratic_cost_type<double> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double __y;
  double theta;
  double dVar3;
  double kappa;
  double objective_amplifier;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  context *this_00;
  bool bVar6;
  int iVar7;
  int iVar8;
  local_context *ctx;
  quadratic_cost_type<double> *pqVar9;
  int push;
  int iVar10;
  long loop;
  double dVar11;
  undefined1 auVar13 [16];
  double dVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 extraout_var [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bit_array x;
  int local_17c;
  double local_178;
  quadratic_cost_type<double> norm_costs;
  compute_order compute;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  slv;
  undefined1 extraout_var_00 [56];
  
  pqVar9 = original_costs;
  bit_array_impl::bit_array_impl(&x.super_bit_array_impl,variables);
  this_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  normalize_costs<double,baryonyx::itm::quadratic_cost_type<double>>
            (&norm_costs,(itm *)this_00,(context *)original_costs,(quadratic_cost_type<double> *)ctx
             ,(random_engine *)(ulong)(uint)variables,(int)pqVar9);
  dVar1 = (this_00->parameters).kappa_step;
  local_178 = (this_00->parameters).delta;
  dVar2 = (this_00->parameters).kappa_max;
  __y = (this_00->parameters).alpha;
  theta = (this_00->parameters).theta;
  if (local_178 < 0.0) {
    local_178 = compute_delta<double,baryonyx::itm::quadratic_cost_type<double>>
                          (this->m_ctx,&norm_costs,theta,variables);
  }
  dVar3 = (this_00->parameters).w;
  kappa = (this_00->parameters).pushing_k_factor;
  objective_amplifier = (this_00->parameters).pushing_objective_amplifier;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  ::solver_inequalities_101coeff
            (&slv,&ctx->rng,
             (int)(((long)(constraints->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(constraints->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28),variables,&norm_costs,
             constraints);
  compute_order::compute_order(&compute,(this_00->parameters).order,variables);
  do {
    bVar6 = false;
LAB_00425b50:
    if (((stop_task->_M_base)._M_i & 1U) != 0) {
      compute_order::~compute_order(&compute);
      solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
      ::~solver_inequalities_101coeff(&slv);
      quadratic_cost_type<double>::~quadratic_cost_type(&norm_costs);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                (&x.super_bit_array_impl.m_data);
      return;
    }
    this->m_call_number = this->m_call_number + 1;
    dVar11 = best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
             ::reinit(best_recorder,ctx,bVar6,(this_00->parameters).kappa_min,
                      (this_00->parameters).kappa_max,&x);
    compute_order::
    init<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array>
              (&compute,&slv,&x);
    auVar15 = ZEXT864((ulong)dVar11);
    iVar10 = 0x7fffffff;
    for (loop = 0; (((stop_task->_M_base)._M_i & 1U) == 0 && (loop != (this_00->parameters).limit));
        loop = loop + 1) {
      auVar13._0_8_ = auVar15._0_8_;
      iVar7 = compute_order::
              run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                        (&compute,&slv,&x,&ctx->rng,auVar13._0_8_,local_178,theta);
      if (iVar7 == 0) {
        dVar12 = quadratic_cost_type<double>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,ctx,&x,dVar12,loop);
        bVar6 = true;
        goto LAB_00425c9f;
      }
      if (iVar7 <= iVar10) {
        iVar10 = iVar7;
      }
      if ((long)dVar3 < loop) {
        auVar15._0_8_ = pow((double)iVar7 / (double)slv.m,__y);
        auVar15._8_56_ = extraout_var;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = auVar13._0_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = dVar1;
        auVar13 = vfmadd231sd_fma(auVar17,auVar15._0_16_,auVar4);
      }
      else {
        auVar13._8_8_ = 0;
      }
      auVar15 = ZEXT1664(auVar13);
      if (dVar2 < auVar13._0_8_) break;
    }
    if (iVar10 < 1) {
      bVar6 = false;
LAB_00425c9f:
      local_17c = 0;
      for (iVar10 = 0;
          (((stop_task->_M_base)._M_i & 1U) == 0 && (iVar10 < (this_00->parameters).pushes_limit));
          iVar10 = iVar10 + 1) {
        iVar7 = compute_order::
                push_and_run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                          (&compute,&slv,&x,&ctx->rng,kappa,local_178,theta,objective_amplifier);
        if (iVar7 == 0) {
          dVar12 = quadratic_cost_type<double>::results(original_costs,&x,cost_constant);
          best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
          ::try_update(best_recorder,ctx,&x,dVar12,
                       (long)~((this_00->parameters).pushing_iteration_limit * iVar10));
          bVar6 = true;
        }
        auVar15 = ZEXT864((ulong)dVar11);
        iVar7 = 1;
        while( true ) {
          if ((((stop_task->_M_base)._M_i & 1U) != 0) ||
             ((this_00->parameters).pushing_iteration_limit <= iVar7 + -1)) goto LAB_00425e2f;
          auVar14._0_8_ = auVar15._0_8_;
          iVar8 = compute_order::
                  run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                            (&compute,&slv,&x,&ctx->rng,auVar14._0_8_,local_178,theta);
          if (iVar8 == 0) break;
          if ((double)(iVar7 + -1) <= (this_00->parameters).w) {
            auVar14._8_8_ = 0;
          }
          else {
            auVar16._0_8_ = pow((double)iVar8 / (double)slv.m,__y);
            auVar16._8_56_ = extraout_var_00;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = auVar14._0_8_;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = dVar1;
            auVar14 = vfmadd231sd_fma(auVar18,auVar16._0_16_,auVar5);
          }
          auVar15 = ZEXT1664(auVar14);
          if (dVar2 < auVar14._0_8_) goto LAB_00425e2f;
          iVar7 = iVar7 + 1;
        }
        dVar12 = quadratic_cost_type<double>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,ctx,&x,dVar12,
                     (long)((this_00->parameters).pushing_iteration_limit * local_17c - iVar7));
        bVar6 = true;
LAB_00425e2f:
        local_17c = local_17c + -1;
      }
      goto LAB_00425b50;
    }
    best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
    ::try_advance(best_recorder,ctx,&x,iVar10,(this_00->parameters).limit);
  } while( true );
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }